

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O2

fdb_status
fdb_compact_file(fdb_file_handle *fhandle,char *new_filename,bool in_place_compaction,
                bid_t marker_bid,bool clone_docs,fdb_encryption_key *new_encryption_key,
                fdb_compact_opt *compact_opt)

{
  err_log_callback *log_callback;
  fdb_kvs_handle *handle;
  hbtrie *trie;
  bool bVar1;
  fdb_status fVar2;
  filemgr *file;
  btreeblk_handle *handle_00;
  docio_handle *handle_01;
  hbtrie *trie_00;
  hbtrie_cmp_map *map_func;
  btree *btree;
  btree_kv_ops *pbVar3;
  btree *pbVar4;
  filemgr_open_result fVar5;
  hbtrie *local_b0;
  filemgr_config fconfig;
  
  handle = fhandle->root;
  filemgr_mutex_lock(handle->file);
  fVar2 = _fdb_compact_file_checks(handle,new_filename);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fdb_sync_db_header(handle);
    _fdb_init_file_config(&handle->config,&fconfig);
    fconfig.options = fconfig.options | 8;
    if (new_encryption_key != (fdb_encryption_key *)0x0) {
      fconfig.encryption_key.bytes._28_4_ = *(undefined4 *)(new_encryption_key->bytes + 0x1c);
      fconfig.encryption_key.algorithm = new_encryption_key->algorithm;
      fconfig.encryption_key.bytes[0] = new_encryption_key->bytes[0];
      fconfig.encryption_key.bytes[1] = new_encryption_key->bytes[1];
      fconfig.encryption_key.bytes[2] = new_encryption_key->bytes[2];
      fconfig.encryption_key.bytes[3] = new_encryption_key->bytes[3];
      fconfig.encryption_key.bytes._4_8_ = *(undefined8 *)(new_encryption_key->bytes + 4);
      fconfig.encryption_key.bytes._12_8_ = *(undefined8 *)(new_encryption_key->bytes + 0xc);
      fconfig.encryption_key.bytes._20_8_ = *(undefined8 *)(new_encryption_key->bytes + 0x14);
    }
    log_callback = &handle->log_callback;
    fVar5 = filemgr_open(new_filename,handle->fileops,&fconfig,log_callback);
    file = fVar5.file;
    fVar2 = fVar5.rv;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      if (file == (filemgr *)0x0) {
        filemgr_mutex_unlock(handle->file);
        return FDB_RESULT_OPEN_FAIL;
      }
      filemgr_fhandle_add(file,handle->fhandle);
      filemgr_set_in_place_compaction(file,in_place_compaction);
      filemgr_mutex_lock(file);
      handle_00 = (btreeblk_handle *)calloc(1,0x78);
      handle_00->log_callback = log_callback;
      handle_01 = (docio_handle *)calloc(1,0x40);
      handle_01->log_callback = log_callback;
      fVar2 = docio_init(handle_01,file,(handle->config).compress_document_body);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        btreeblk_init(handle_00,file,file->blocksize);
        trie_00 = (hbtrie *)malloc(0x70);
        hbtrie_init(trie_00,(uint)handle->trie->chunksize,(uint)handle->trie->valuelen,
                    file->blocksize,0xffffffffffffffff,handle_00,handle->btreeblkops,handle_01,
                    _fdb_readkey_wrap);
        hbtrie_set_leaf_cmp(trie_00,_fdb_custom_cmp_wrap);
        trie = handle->trie;
        trie_00->flag = trie->flag;
        trie_00->leaf_height_limit = trie->leaf_height_limit;
        map_func = hbtrie_get_map_function(trie);
        hbtrie_set_map_function(trie_00,map_func);
        if ((handle->config).seqtree_opt == '\x01') {
          if (handle->kvs == (kvs_info *)0x0) {
            btree = (btree *)calloc(1,0x38);
            pbVar4 = (handle->field_6).seqtree;
            btree_init(btree,handle_00,pbVar4->blk_ops,pbVar4->kv_ops,pbVar4->blksize,pbVar4->ksize,
                       pbVar4->vsize,0,(btree_meta *)0x0);
            local_b0 = (hbtrie *)0x0;
            goto LAB_0012077d;
          }
          local_b0 = (hbtrie *)calloc(1,0x70);
          hbtrie_init(local_b0,8,8,file->blocksize,0xffffffffffffffff,handle_00,handle->btreeblkops,
                      handle_01,_fdb_readseq_wrap);
        }
        else {
          local_b0 = (hbtrie *)0x0;
        }
        btree = (btree *)0x0;
LAB_0012077d:
        bVar1 = ver_staletree_support(0xdeadcafebeefc002);
        if (bVar1) {
          if (handle->staletree == (btree *)0x0) {
            pbVar3 = (btree_kv_ops *)calloc(1,0x78);
            pbVar3 = btree_kv_get_kb64_vb64(pbVar3);
            pbVar3->cmp = _cmp_uint64_t_endian_safe;
          }
          else {
            pbVar3 = handle->staletree->kv_ops;
          }
          pbVar4 = (btree *)calloc(1,0x38);
          btree_init(pbVar4,handle_00,handle->btreeblkops,pbVar3,(handle->config).blocksize,'\b',
                     '\b',0,(btree_meta *)0x0);
        }
        else {
          pbVar4 = (btree *)0x0;
        }
        fVar2 = _fdb_compact_file(handle,file,handle_00,handle_01,trie_00,local_b0,btree,pbVar4,
                                  marker_bid,clone_docs,compact_opt);
        return fVar2;
      }
      free(handle_00);
      free(handle_01);
      goto LAB_001205dc;
    }
  }
  file = handle->file;
LAB_001205dc:
  filemgr_mutex_unlock(file);
  return fVar2;
}

Assistant:

fdb_status fdb_compact_file(fdb_file_handle *fhandle,
                            const char *new_filename,
                            bool in_place_compaction,
                            bid_t marker_bid,
                            bool clone_docs,
                            const fdb_encryption_key *new_encryption_key,
                            const fdb_compact_opt* compact_opt)
{
    struct filemgr *new_file;
    struct filemgr_config fconfig;
    struct btreeblk_handle *new_bhandle;
    struct docio_handle *new_dhandle;
    struct hbtrie *new_trie = NULL;
    struct btree *new_seqtree = NULL, *old_seqtree;
    struct btree *new_staletree = NULL;
    struct hbtrie *new_seqtrie = NULL;
    fdb_kvs_handle *handle = fhandle->root;
    fdb_status status;
    LATENCY_STAT_START();

    // prevent update to the target file
    filemgr_mutex_lock(handle->file);

    status = _fdb_compact_file_checks(handle, new_filename);
    if (status != FDB_RESULT_SUCCESS) {
        filemgr_mutex_unlock(handle->file);
        return status;
    }

    // sync handle
    fdb_sync_db_header(handle);

    // set filemgr configuration
    _fdb_init_file_config(&handle->config, &fconfig);
    fconfig.options |= FILEMGR_CREATE;
    if (new_encryption_key) {
        fconfig.encryption_key = *new_encryption_key;
    }

    // open new file
    filemgr_open_result result = filemgr_open((char *)new_filename,
                                              handle->fileops,
                                              &fconfig,
                                              &handle->log_callback);
    if (result.rv != FDB_RESULT_SUCCESS) {
        filemgr_mutex_unlock(handle->file);
        return (fdb_status) result.rv;
    }

    new_file = result.file;

    if (new_file == NULL) {
        filemgr_mutex_unlock(handle->file);
        return FDB_RESULT_OPEN_FAIL;
    }

    filemgr_fhandle_add(new_file, handle->fhandle);

    filemgr_set_in_place_compaction(new_file, in_place_compaction);
    // prevent update to the new_file
    filemgr_mutex_lock(new_file);

    // create new hb-trie and related handles
    new_bhandle = (struct btreeblk_handle *)calloc(1, sizeof(struct btreeblk_handle));
    new_bhandle->log_callback = &handle->log_callback;
    new_dhandle = (struct docio_handle *)calloc(1, sizeof(struct docio_handle));
    new_dhandle->log_callback = &handle->log_callback;

    status = docio_init(new_dhandle, new_file,
                        handle->config.compress_document_body);
    if (status != FDB_RESULT_SUCCESS) {
        free(new_bhandle);
        free(new_dhandle);
        filemgr_mutex_unlock(new_file);
        return status;
    }

    btreeblk_init(new_bhandle, new_file, new_file->blocksize);

    new_trie = (struct hbtrie *)malloc(sizeof(struct hbtrie));
    hbtrie_init(new_trie, handle->trie->chunksize, handle->trie->valuelen,
                new_file->blocksize, BLK_NOT_FOUND,
                (void *)new_bhandle, handle->btreeblkops,
                (void*)new_dhandle, _fdb_readkey_wrap);

    hbtrie_set_leaf_cmp(new_trie, _fdb_custom_cmp_wrap);
    // set aux
    new_trie->flag = handle->trie->flag;
    new_trie->leaf_height_limit = handle->trie->leaf_height_limit;
    hbtrie_set_map_function(new_trie, hbtrie_get_map_function(handle->trie));

    if (handle->config.seqtree_opt == FDB_SEQTREE_USE) {
        // if we use sequence number tree
        if (handle->kvs) { // multi KV instance mode
            new_seqtrie = (struct hbtrie *)calloc(1, sizeof(struct hbtrie));

            hbtrie_init(new_seqtrie, sizeof(fdb_kvs_id_t),
                        OFFSET_SIZE, new_file->blocksize, BLK_NOT_FOUND,
                        (void *)new_bhandle, handle->btreeblkops,
                        (void *)new_dhandle, _fdb_readseq_wrap);
        } else {
            new_seqtree = (struct btree *)calloc(1, sizeof(struct btree));
            old_seqtree = handle->seqtree;

            btree_init(new_seqtree, (void *)new_bhandle,
                       old_seqtree->blk_ops, old_seqtree->kv_ops,
                       old_seqtree->blksize, old_seqtree->ksize,
                       old_seqtree->vsize, 0x0, NULL);
        }
    }

    // stale-block tree
    if (ver_staletree_support(ver_get_latest_magic())) {
        struct btree_kv_ops *stale_kv_ops;
        if (handle->staletree) {
            stale_kv_ops = handle->staletree->kv_ops;
        } else {
            // this happens when the old file's version is older than MAGIC_002.
            stale_kv_ops = (struct btree_kv_ops*)calloc(1, sizeof(struct btree_kv_ops));
            stale_kv_ops = btree_kv_get_kb64_vb64(stale_kv_ops);
            stale_kv_ops->cmp = _cmp_uint64_t_endian_safe;
        }

        new_staletree = (struct btree*)calloc(1, sizeof(struct btree));
        btree_init(new_staletree, (void *)new_bhandle,
                   handle->btreeblkops, stale_kv_ops,
                   handle->config.blocksize, sizeof(filemgr_header_revnum_t),
                   OFFSET_SIZE, 0x0, NULL);
    } else {
        new_staletree = NULL;
    }

    status = _fdb_compact_file(handle, new_file, new_bhandle, new_dhandle,
                               new_trie, new_seqtrie, new_seqtree, new_staletree,
                               marker_bid, clone_docs, compact_opt);
    LATENCY_STAT_END(fhandle->root->file, FDB_LATENCY_COMPACTS);

    return status;
}